

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

double __thiscall llvm::ECError::log(ECError *this,double __x)

{
  error_category *peVar1;
  size_t in_RCX;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  long *local_30;
  void *local_28;
  long local_20 [2];
  
  peVar1 = (this->EC)._M_cat;
  (**(code **)(*(long *)peVar1 + 0x20))(&local_30,peVar1,(this->EC)._M_value);
  raw_ostream::write(in_RSI,(int)local_30,local_28,in_RCX);
  dVar2 = extraout_XMM0_Qa;
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void log(raw_ostream &OS) const override { OS << EC.message(); }